

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c74_mock_clock.h
# Opt level: O3

void __thiscall c74::mock::clock::tick(clock *this)

{
  multiset<c74::mock::clock::event,_std::less<c74::mock::clock::event>,_std::allocator<c74::mock::clock::event>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  __atomic_flag_data_type _Var2;
  pointer peVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  iterator iVar7;
  long lVar8;
  _Base_ptr p_Var9;
  multiset<c74::mock::clock::event,_std::less<c74::mock::clock::event>,_std::allocator<c74::mock::clock::event>_>
  *__range3;
  event *e;
  key_type *__k;
  pointer peVar10;
  pair<std::_Rb_tree_iterator<c74::mock::clock::event>,_std::_Rb_tree_iterator<c74::mock::clock::event>_>
  pVar11;
  unique_lock<std::mutex> pending_lock;
  vector<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_> events_that_ran;
  unique_lock<std::mutex> scheduled_lock;
  unique_lock<std::mutex> local_88;
  key_type *local_78;
  iterator iStack_70;
  event *local_68;
  unique_lock<std::mutex> local_60;
  condition_variable *local_50;
  mutex *local_48;
  mutex *local_40;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_38;
  
  LOCK();
  _Var2 = (this->run_thread).super___atomic_flag_base._M_i;
  (this->run_thread).super___atomic_flag_base._M_i = true;
  UNLOCK();
  if (_Var2 != false) {
    local_40 = &this->pending_events_mutex;
    local_48 = &this->scheduled_events_mutex;
    this_00 = &this->scheduled_events;
    p_Var1 = &(this->scheduled_events)._M_t._M_impl.super__Rb_tree_header;
    local_50 = &this->cv;
    do {
      local_88._M_device = local_40;
      local_88._M_owns = false;
      std::unique_lock<std::mutex>::lock(&local_88);
      local_88._M_owns = true;
      local_60._M_device = local_48;
      local_60._M_owns = false;
      std::unique_lock<std::mutex>::lock(&local_60);
      local_60._M_owns = true;
      peVar10 = (this->pending_events).
                super__Vector_base<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_>
                ._M_impl.super__Vector_impl_data._M_start;
      peVar3 = (this->pending_events).
               super__Vector_base<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (peVar10 != peVar3) {
        do {
          std::
          _Rb_tree<c74::mock::clock::event,c74::mock::clock::event,std::_Identity<c74::mock::clock::event>,std::less<c74::mock::clock::event>,std::allocator<c74::mock::clock::event>>
          ::_M_insert_equal<c74::mock::clock::event_const&>
                    ((_Rb_tree<c74::mock::clock::event,c74::mock::clock::event,std::_Identity<c74::mock::clock::event>,std::less<c74::mock::clock::event>,std::allocator<c74::mock::clock::event>>
                      *)this_00,peVar10);
          peVar10 = peVar10 + 1;
        } while (peVar10 != peVar3);
        peVar10 = (this->pending_events).
                  super__Vector_base<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((this->pending_events).
            super__Vector_base<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_>.
            _M_impl.super__Vector_impl_data._M_finish != peVar10) {
          (this->pending_events).
          super__Vector_base<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_>.
          _M_impl.super__Vector_impl_data._M_finish = peVar10;
        }
      }
      std::unique_lock<std::mutex>::unlock(&local_88);
      local_78 = (key_type *)0x0;
      iStack_70._M_current = (key_type *)0x0;
      local_68 = (event *)0x0;
      p_Var9 = (this->scheduled_events)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((_Rb_tree_header *)p_Var9 != p_Var1) {
        do {
          lVar8 = std::chrono::_V2::steady_clock::now();
          __k = local_78;
          iVar7._M_current = iStack_70._M_current;
          if (lVar8 < *(long *)(p_Var9 + 1)) break;
          if (iStack_70._M_current == local_68) {
            std::vector<c74::mock::clock::event,std::allocator<c74::mock::clock::event>>::
            _M_realloc_insert<c74::mock::clock::event_const&>
                      ((vector<c74::mock::clock::event,std::allocator<c74::mock::clock::event>> *)
                       &local_78,iStack_70,(event *)(p_Var9 + 1));
          }
          else {
            (iStack_70._M_current)->m_baton = p_Var9[1]._M_left;
            uVar4 = *(undefined4 *)&p_Var9[1].field_0x4;
            uVar5 = *(undefined4 *)&p_Var9[1]._M_parent;
            uVar6 = *(undefined4 *)((long)&p_Var9[1]._M_parent + 4);
            *(int *)&((iStack_70._M_current)->m_onset).__d.__r =
                 (int)(((timepoint *)&p_Var9[1]._M_color)->__d).__r;
            *(undefined4 *)((long)&((iStack_70._M_current)->m_onset).__d.__r + 4) = uVar4;
            *(undefined4 *)&(iStack_70._M_current)->m_meth = uVar5;
            *(undefined4 *)((long)&(iStack_70._M_current)->m_meth + 4) = uVar6;
            iStack_70._M_current = iStack_70._M_current + 1;
          }
          (*(code *)p_Var9[1]._M_parent)(p_Var9[1]._M_left);
          p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
          __k = local_78;
          iVar7._M_current = iStack_70._M_current;
        } while ((_Rb_tree_header *)p_Var9 != p_Var1);
        for (; __k != iVar7._M_current; __k = __k + 1) {
          pVar11 = std::
                   _Rb_tree<c74::mock::clock::event,_c74::mock::clock::event,_std::_Identity<c74::mock::clock::event>,_std::less<c74::mock::clock::event>,_std::allocator<c74::mock::clock::event>_>
                   ::equal_range(&this_00->_M_t,__k);
          std::
          _Rb_tree<c74::mock::clock::event,_c74::mock::clock::event,_std::_Identity<c74::mock::clock::event>,_std::less<c74::mock::clock::event>,_std::allocator<c74::mock::clock::event>_>
          ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar11.first._M_node,
                         (_Base_ptr)pVar11.second._M_node);
        }
      }
      std::unique_lock<std::mutex>::lock(&local_88);
      peVar10 = (this->pending_events).
                super__Vector_base<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_>
                ._M_impl.super__Vector_impl_data._M_start;
      peVar3 = (this->pending_events).
               super__Vector_base<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (peVar10 != peVar3) {
        do {
          std::
          _Rb_tree<c74::mock::clock::event,c74::mock::clock::event,std::_Identity<c74::mock::clock::event>,std::less<c74::mock::clock::event>,std::allocator<c74::mock::clock::event>>
          ::_M_insert_equal<c74::mock::clock::event_const&>
                    ((_Rb_tree<c74::mock::clock::event,c74::mock::clock::event,std::_Identity<c74::mock::clock::event>,std::less<c74::mock::clock::event>,std::allocator<c74::mock::clock::event>>
                      *)this_00,peVar10);
          peVar10 = peVar10 + 1;
        } while (peVar10 != peVar3);
        peVar10 = (this->pending_events).
                  super__Vector_base<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((this->pending_events).
            super__Vector_base<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_>.
            _M_impl.super__Vector_impl_data._M_finish != peVar10) {
          (this->pending_events).
          super__Vector_base<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_>.
          _M_impl.super__Vector_impl_data._M_finish = peVar10;
        }
      }
      if ((this->scheduled_events)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        lVar8 = std::chrono::_V2::steady_clock::now();
        local_38.__d.__r = (duration)(lVar8 + 3600000000000);
      }
      else {
        local_38.__d.__r =
             *(duration *)
              ((this->scheduled_events)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1);
      }
      std::unique_lock<std::mutex>::unlock(&local_60);
      std::condition_variable::
      __wait_until_impl<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                (local_50,&local_88,&local_38);
      if (local_78 != (key_type *)0x0) {
        operator_delete(local_78,(long)local_68 - (long)local_78);
      }
      std::unique_lock<std::mutex>::~unique_lock(&local_60);
      std::unique_lock<std::mutex>::~unique_lock(&local_88);
      LOCK();
      _Var2 = (this->run_thread).super___atomic_flag_base._M_i;
      (this->run_thread).super___atomic_flag_base._M_i = true;
      UNLOCK();
    } while (_Var2 != false);
  }
  return;
}

Assistant:

void tick() {
			while (run_thread.test_and_set()) {
#ifdef WIN_VERSION
				// On Windows an exception will be thrown when we try to lock the mutex wihout some sort of time passage
				// (either a console post or an explicit short delay)
				// std::cout << c74::mock::clock::tick()" << std::endl;
				std::this_thread::sleep_for(1ms);
#endif
				std::unique_lock<std::mutex> pending_lock(pending_events_mutex);
				std::unique_lock<std::mutex> scheduled_lock(scheduled_events_mutex);

				// update list of events
				for (auto &e : pending_events)
					scheduled_events.insert(e);
				pending_events.clear();

				// User code can add new events, so don't lock pending_events
				// while calling the scheduled events!
				pending_lock.unlock();

				std::vector<event> events_that_ran;
				for (auto& e : scheduled_events) {
					if (e > now()) {
						//std::cout << time(now()) << " (all remaining events in the future)" << std::endl;
						break;
					}
					//std::cout << time(now()) << " (event to run)" << std::endl;
					events_that_ran.push_back(e);
					e();
				}

				// purge events that have run
				for (auto& e : events_that_ran)
					scheduled_events.erase(e);


				// events themselves may have added new (pending) events
				pending_lock.lock();
				for (auto &e : pending_events)
					scheduled_events.insert(e);
				pending_events.clear();
        
				const auto next = scheduled_events.empty() ? now()+1h : scheduled_events.begin()->onset();
				scheduled_lock.unlock(); // we're not touching any scheduled events anymore. Unlock the scheduled_events_mutex.
				cv.wait_until(pending_lock, next);
			}
        }